

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char **p;
  char *pcVar5;
  uchar *puVar6;
  Mem *pMVar7;
  ulong uVar8;
  ulong uVar9;
  char **ppcVar10;
  uint uVar11;
  Vdbe *pVm;
  Vdbe *p_00;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  Vdbe *local_70;
  uint local_64;
  sqlite3 *local_60;
  char *local_58;
  uint local_4c;
  char **local_48;
  sqlite3_callback local_40;
  void *local_38;
  
  local_70 = (Vdbe *)0x0;
  local_40 = xCallback;
  local_38 = pArg;
  iVar3 = sqlite3SafetyCheckOk(db);
  if (iVar3 == 0) {
    uVar4 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1d0a3,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
  }
  else {
    pcVar5 = "";
    if (zSql != (char *)0x0) {
      pcVar5 = zSql;
    }
    local_48 = pzErrMsg;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    db->errCode = 0;
    local_60 = db;
    if (db->pErr != (sqlite3_value *)0x0) {
      sqlite3ErrorFinish(db,0);
    }
    while( true ) {
      if (*pcVar5 == '\0') break;
      local_70 = (Vdbe *)0x0;
      uVar4 = sqlite3LockAndPrepare
                        (db,pcVar5,-1,0x80,(Vdbe *)0x0,(sqlite3_stmt **)&local_70,&local_58);
      if (uVar4 != 0) goto LAB_001267d1;
      if (local_70 == (Vdbe *)0x0) {
        uVar4 = 0;
        pcVar5 = local_58;
      }
      else {
        p = (char **)0x0;
        bVar2 = false;
        local_64 = 0;
        ppcVar10 = (char **)0x0;
        p_00 = local_70;
        do {
          uVar4 = sqlite3_step((sqlite3_stmt *)p_00);
          if (local_40 != (sqlite3_callback)0x0) {
            if (uVar4 == 100) {
              if (!bVar2) goto LAB_001265da;
LAB_00126644:
              uVar8 = (ulong)local_64;
              ppcVar10 = p + uVar8;
              local_4c = uVar4;
              if ((int)local_64 < 1) {
                uVar8 = 0;
              }
              else {
                uVar9 = 0;
                do {
                  puVar6 = sqlite3_column_text((sqlite3_stmt *)local_70,(int)uVar9);
                  p_00 = local_70;
                  ppcVar10[uVar9] = (char *)puVar6;
                  if (puVar6 == (uchar *)0x0) {
                    pMVar7 = columnMem((sqlite3_stmt *)local_70,(int)uVar9);
                    uVar4._0_2_ = pMVar7->flags;
                    uVar4._2_1_ = pMVar7->enc;
                    uVar4._3_1_ = pMVar7->eSubtype;
                    columnMallocFailure((sqlite3_stmt *)p_00);
                    db = local_60;
                    if ((0xaaaaaaaaU >> (uVar4 & 0x1f) & 1) == 0) {
                      sqlite3OomFault(local_60);
                      uVar4 = 100;
                      goto LAB_001267d9;
                    }
                  }
                  uVar9 = uVar9 + 1;
                } while (uVar8 != uVar9);
              }
              ppcVar10[uVar8] = (char *)0x0;
              uVar4 = local_4c;
            }
            else {
              if (((uVar4 != 0x65) || (bVar2)) || ((db->flags & 0x100) == 0)) break;
LAB_001265da:
              if (p_00 == (Vdbe *)0x0) {
                uVar11 = 0;
              }
              else {
                uVar11 = (uint)p_00->nResColumn;
              }
              p = (char **)sqlite3DbMallocRawNN(db,(ulong)(uVar11 << 4 | 8));
              if (p == (char **)0x0) {
                p = (char **)0x0;
                goto LAB_001267d9;
              }
              local_64 = uVar11;
              if (uVar11 != 0) {
                uVar8 = 0;
                do {
                  pcVar5 = (char *)columnName((sqlite3_stmt *)p_00,(int)uVar8,0,0);
                  p[uVar8] = pcVar5;
                  uVar8 = uVar8 + 1;
                } while (uVar11 != uVar8);
              }
              if (uVar4 == 100) goto LAB_00126644;
            }
            db = local_60;
            iVar3 = (*local_40)(local_38,local_64,ppcVar10,p);
            bVar2 = true;
            p_00 = local_70;
            if (iVar3 != 0) {
              sqlite3VdbeFinalize(local_70);
              local_70 = (Vdbe *)0x0;
              db->errCode = 4;
              uVar4 = 4;
              sqlite3ErrorFinish(db,4);
              ppcVar10 = local_48;
              goto LAB_001267f0;
            }
          }
        } while (uVar4 == 100);
        uVar4 = sqlite3VdbeFinalize(p_00);
        local_70 = (Vdbe *)0x0;
        pcVar5 = local_58 + -1;
        do {
          pbVar1 = (byte *)(pcVar5 + 1);
          pcVar5 = pcVar5 + 1;
        } while ((""[*pbVar1] & 1) != 0);
        if (p != (char **)0x0) {
          sqlite3DbFreeNN(db,p);
        }
      }
      if (uVar4 != 0) goto LAB_001267d1;
    }
    uVar4 = 0;
LAB_001267d1:
    p = (char **)0x0;
    p_00 = local_70;
LAB_001267d9:
    ppcVar10 = local_48;
    if (p_00 != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(p_00);
    }
    if (p != (char **)0x0) {
LAB_001267f0:
      sqlite3DbFreeNN(db,p);
    }
    if ((uVar4 == 0xc0a) || (db->mallocFailed != '\0')) {
      apiOomError(db);
      uVar4 = 7;
    }
    else {
      uVar4 = uVar4 & db->errMask;
    }
    if ((ppcVar10 == (char **)0x0) || (uVar4 == 0)) {
      if (ppcVar10 != (char **)0x0) {
        *ppcVar10 = (char *)0x0;
      }
    }
    else {
      pcVar5 = sqlite3_errmsg(db);
      pcVar5 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar5);
      *ppcVar10 = pcVar5;
      if (pcVar5 == (char *)0x0) {
        db->errCode = 7;
        uVar4 = 7;
        sqlite3ErrorFinish(db,7);
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return uVar4;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol = 0;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }
    callbackIsInit = 0;

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc || 
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          nCol = sqlite3_column_count(pStmt);
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}